

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O3

void __thiscall SchemeFilePort::~SchemeFilePort(SchemeFilePort *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pair<std::_Rb_tree_iterator<SchemeFilePort_*>,_std::_Rb_tree_iterator<SchemeFilePort_*>_> pVar2;
  SchemeFilePort *local_10;
  
  (this->super_SchemePort).super_SchemeObject._vptr_SchemeObject =
       (_func_int **)&PTR__SchemeFilePort_0016b598;
  local_10 = this;
  pVar2 = std::
          _Rb_tree<SchemeFilePort_*,_SchemeFilePort_*,_std::_Identity<SchemeFilePort_*>,_std::less<SchemeFilePort_*>,_std::allocator<SchemeFilePort_*>_>
          ::equal_range(&open_files._M_t,&local_10);
  std::
  _Rb_tree<SchemeFilePort_*,_SchemeFilePort_*,_std::_Identity<SchemeFilePort_*>,_std::less<SchemeFilePort_*>,_std::allocator<SchemeFilePort_*>_>
  ::_M_erase_aux(&open_files._M_t,(_Base_ptr)pVar2.first._M_node,(_Base_ptr)pVar2.second._M_node);
  (this->super_SchemePort).super_SchemeObject._vptr_SchemeObject =
       (_func_int **)&PTR__SchemePort_0016bd10;
  p_Var1 = (this->super_SchemePort).output_stream.
           super___shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->super_SchemePort).input_stream.
           super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  return;
}

Assistant:

SchemeFilePort::~SchemeFilePort()
{
    open_files.erase(this);
}